

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_c.c
# Opt level: O2

uint32_t adler32_c(uint32_t adler,uint8_t *buf,size_t len)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar14 = (ulong)adler & 0xffff;
  uVar1 = (uint32_t)uVar14;
  uVar11 = adler >> 0x10;
  uVar3 = (ulong)uVar11;
  if (len == 1) {
    uVar13 = uVar1 + *buf;
    uVar12 = uVar13 - 0xfff1;
    if (uVar13 < 0xfff1) {
      uVar12 = uVar13;
    }
    return ((uVar11 + uVar12) % 0xfff1) * 0x10000 + uVar12;
  }
  if (buf == (uint8_t *)0x0) {
    return 1;
  }
  if (0xf < len) {
    while (0x15af < len) {
      len = len - 0x15b0;
      lVar2 = 0;
      do {
        iVar4 = (uint)buf[lVar2 * 8] + (int)uVar14;
        iVar8 = (uint)buf[lVar2 * 8 + 1] + iVar4;
        iVar5 = (uint)buf[lVar2 * 8 + 2] + iVar8;
        iVar9 = (uint)buf[lVar2 * 8 + 3] + iVar5;
        iVar6 = (uint)buf[lVar2 * 8 + 4] + iVar9;
        iVar10 = (uint)buf[lVar2 * 8 + 5] + iVar6;
        iVar7 = (uint)buf[lVar2 * 8 + 6] + iVar10;
        uVar11 = (uint)buf[lVar2 * 8 + 7] + iVar7;
        uVar14 = (ulong)uVar11;
        uVar3 = (ulong)((int)uVar3 + iVar4 + iVar8 + iVar5 + iVar9 + iVar6 + iVar10 + iVar7 + uVar11
                       );
        lVar2 = lVar2 + 1;
      } while ((int)lVar2 != 0x2b6);
      buf = buf + 0x15b0;
      uVar14 = (ulong)uVar11 % 0xfff1;
      uVar3 = uVar3 % 0xfff1;
    }
    while( true ) {
      uVar1 = (uint32_t)uVar14;
      uVar11 = (uint)uVar3;
      if (len < 8) break;
      len = len - 8;
      iVar4 = (uint)buf[1] + uVar1 + *buf;
      iVar7 = (uint)buf[2] + iVar4;
      iVar5 = (uint)buf[3] + iVar7;
      iVar8 = (uint)buf[4] + iVar5;
      iVar6 = (uint)buf[5] + iVar8;
      iVar9 = (uint)buf[6] + iVar6;
      uVar12 = (uint)buf[7] + iVar9;
      uVar14 = (ulong)uVar12;
      uVar3 = (ulong)(uVar11 + uVar1 + *buf + iVar4 + iVar7 + iVar5 + iVar8 + iVar6 + iVar9 + uVar12
                     );
      buf = buf + 8;
    }
  }
  uVar1 = adler32_len_16(uVar1,buf,len,uVar11);
  return uVar1;
}

Assistant:

Z_INTERNAL uint32_t adler32_c(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
#ifdef UNROLL_MORE
        n = NMAX / 16;          /* NMAX is divisible by 16 */
#else
        n = NMAX / 8;           /* NMAX is divisible by 8 */
#endif
        do {
#ifdef UNROLL_MORE
            ADLER_DO16(adler, sum2, buf);          /* 16 sums unrolled */
            buf += 16;
#else
            ADLER_DO8(adler, sum2, buf, 0);         /* 8 sums unrolled */
            buf += 8;
#endif
        } while (--n);
        adler %= BASE;
        sum2 %= BASE;
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    return adler32_len_64(adler, buf, len, sum2);
}